

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

int __thiscall OpenMD::StringTokenizer::nextTokenAsInt(StringTokenizer *this)

{
  int iVar1;
  char *__nptr;
  string token;
  StringTokenizer *in_stack_00000078;
  string local_28 [40];
  
  nextToken_abi_cxx11_(in_stack_00000078);
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar1 = atoi(__nptr);
  std::__cxx11::string::~string(local_28);
  return iVar1;
}

Assistant:

int StringTokenizer::nextTokenAsInt() {
    std::string token = nextToken();

    return atoi(token.c_str());
  }